

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

int ON_Get3dConvexHull(ON_SimpleArray<ON_3dPoint> *points,ON_SimpleArray<ON_PlaneEquation> *hull)

{
  size_t new_capacity;
  ON_3dPoint *pOVar1;
  bool bVar2;
  int iVar3;
  ON_PlaneEquation *pOVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  ON_PlaneEquation local_1a8;
  double local_188;
  undefined8 uStack_180;
  long local_170;
  double local_168;
  undefined8 uStack_160;
  ulong local_150;
  long local_148;
  long local_140;
  double local_138;
  undefined8 uStack_130;
  size_t local_120;
  ulong local_118;
  ulong local_110;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  ON_3dVector local_d8;
  ON_3dVector local_c0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  ON_3dVector local_48;
  
  iVar5 = points->m_count;
  uVar9 = (ulong)iVar5;
  iVar3 = 0;
  if (2 < (long)uVar9) {
    local_170 = (long)hull->m_count;
    new_capacity = local_170 + 4;
    if ((uint)hull->m_capacity < (uint)new_capacity) {
      ON_SimpleArray<ON_PlaneEquation>::SetCapacity(hull,new_capacity);
    }
    local_120 = new_capacity;
    ON_PlaneEquation::ON_PlaneEquation(&local_1a8);
    local_148 = 2;
    local_150 = 1;
    local_118 = 0;
    do {
      uVar7 = local_118 + 1;
      if (uVar7 < uVar9) {
        pOVar1 = points->m_a;
        local_e8 = pOVar1[local_118].x;
        uStack_e0 = 0;
        local_f8 = pOVar1[local_118].y;
        uStack_f0 = 0;
        local_108 = pOVar1[local_118].z;
        uStack_100 = 0;
        local_140 = local_148;
        uVar6 = local_150;
        local_118 = uVar7;
        do {
          local_110 = uVar6 + 1;
          if ((int)local_110 < iVar5) {
            pOVar1 = points->m_a;
            local_88 = pOVar1[uVar6].z;
            local_98 = pOVar1[uVar6].x;
            local_a8 = pOVar1[uVar6].y;
            local_58 = local_98 - local_e8;
            uStack_50 = 0;
            local_68 = local_a8 - local_f8;
            uStack_60 = 0;
            local_78 = local_88 - local_108;
            uStack_70 = 0;
            dStack_80 = local_108;
            dStack_90 = local_e8;
            dStack_a0 = local_f8;
            lVar10 = local_140;
            do {
              pOVar1 = points->m_a;
              local_168 = pOVar1[lVar10].x;
              local_138 = pOVar1[lVar10].y;
              local_188 = pOVar1[lVar10].z;
              ON_3dVector::ON_3dVector(&local_c0,local_58,local_68,local_78);
              ON_3dVector::ON_3dVector
                        (&local_d8,local_168 - local_e8,local_138 - local_f8,local_188 - local_108);
              ON_3dVector::ON_3dVector
                        (&local_48,local_c0.y * local_d8.z - local_c0.z * local_d8.y,
                         local_c0.z * local_d8.x - local_d8.z * local_c0.x,
                         local_c0.x * local_d8.y - local_c0.y * local_d8.x);
              local_1a8.z = local_48.z;
              local_1a8.x = local_48.x;
              local_1a8.y = local_48.y;
              bVar2 = ON_3dVector::Unitize((ON_3dVector *)&local_1a8);
              if (bVar2) {
                dVar12 = local_1a8.z * dStack_80 + local_1a8.x * dStack_90 + local_1a8.y * dStack_a0
                ;
                local_1a8.d = -dVar12;
                dVar14 = dVar12 - dVar12;
                dVar11 = (local_1a8.z * local_88 + local_1a8.x * local_98 + local_1a8.y * local_a8)
                         - dVar12;
                dVar16 = dVar11;
                if ((dVar11 < dVar14) || (dVar16 = dVar14, dVar11 <= dVar14)) {
                  dVar11 = dVar14;
                  dVar14 = dVar16;
                }
                dVar15 = (local_188 * local_1a8.z +
                         local_168 * local_1a8.x + local_138 * local_1a8.y) - dVar12;
                dVar16 = dVar15;
                if ((dVar15 < dVar14) || (dVar16 = dVar14, dVar15 <= dVar11)) {
                  dVar14 = dVar16;
                  dVar15 = dVar11;
                }
                dVar11 = -2.3283064365386963e-10;
                if (dVar14 <= -2.3283064365386963e-10) {
                  dVar11 = dVar14;
                }
                dVar14 = 2.3283064365386963e-10;
                if (2.3283064365386963e-10 <= dVar15) {
                  dVar14 = dVar15;
                }
                dVar16 = 0.0;
                uVar7 = 0;
                dVar15 = 0.0;
                do {
                  pdVar8 = &points->m_a[uVar7].z;
                  while (dVar13 = (*pdVar8 * local_1a8.z +
                                  ((ON_3dPoint *)(pdVar8 + -2))->x * local_1a8.x +
                                  pdVar8[-1] * local_1a8.y) - dVar12, dVar15 <= dVar13) {
                    if (dVar16 < dVar13) {
                      bVar2 = dVar11 <= dVar15 || dVar13 <= dVar14;
                      dVar16 = dVar13;
                      dVar13 = dVar15;
                      goto LAB_0057e50c;
                    }
                    uVar7 = uVar7 + 1;
                    pdVar8 = pdVar8 + 3;
                    if (uVar9 <= uVar7) goto LAB_0057e526;
                  }
                  bVar2 = dVar16 <= dVar14 || dVar11 <= dVar13;
LAB_0057e50c:
                  uVar7 = uVar7 + 1;
                  dVar15 = dVar13;
                } while ((uVar7 < uVar9) && (bVar2));
                if (bVar2) {
LAB_0057e526:
                  if (dVar16 <= dVar14) {
                    uStack_160 = 0;
                    local_168 = dVar16;
                    if (dVar11 <= dVar15) {
                      uStack_180 = 0;
                      uStack_130 = 0;
                      iVar3 = (int)local_170;
                      if ((-1 < iVar3) && (iVar3 <= hull->m_capacity)) {
                        hull->m_count = iVar3;
                      }
                      local_188 = dVar15;
                      local_138 = dVar11;
                      pOVar4 = ON_SimpleArray<ON_PlaneEquation>::AppendNew(hull);
                      *(undefined4 *)&pOVar4->x = local_1a8.x._0_4_;
                      *(uint *)((long)&pOVar4->x + 4) = local_1a8.x._4_4_ ^ 0x80000000;
                      *(int *)&pOVar4->y = SUB84(local_1a8.y,0);
                      *(uint *)((long)&pOVar4->y + 4) =
                           (uint)((ulong)local_1a8.y >> 0x20) ^ 0x80000000;
                      *(undefined4 *)&pOVar4->z = local_1a8.z._0_4_;
                      *(uint *)((long)&pOVar4->z + 4) = local_1a8.z._4_4_ ^ 0x80000000;
                      *(int *)&pOVar4->d = SUB84(local_1a8.d - local_188,0);
                      *(uint *)((long)&pOVar4->d + 4) =
                           (uint)((ulong)(local_1a8.d - local_188) >> 0x20) ^ 0x80000000;
                      pOVar4 = ON_SimpleArray<ON_PlaneEquation>::AppendNew(hull);
                      pOVar4->x = local_1a8.x;
                      pOVar4->y = local_1a8.y;
                      pOVar4->z = local_1a8.z;
                      pOVar4->d = local_1a8.d - local_168;
                      if (local_138 <= local_188) {
                        return 2;
                      }
                    }
                    else {
                      pOVar4 = ON_SimpleArray<ON_PlaneEquation>::AppendNew(hull);
                      pOVar4->x = local_1a8.x;
                      pOVar4->y = local_1a8.y;
                      pOVar4->z = local_1a8.z;
                      pOVar4->d = local_1a8.d - local_168;
                    }
                  }
                  else if (dVar11 <= dVar15) {
                    uStack_180 = 0;
                    local_188 = dVar15;
                    pOVar4 = ON_SimpleArray<ON_PlaneEquation>::AppendNew(hull);
                    *(undefined4 *)&pOVar4->x = local_1a8.x._0_4_;
                    *(uint *)((long)&pOVar4->x + 4) = local_1a8.x._4_4_ ^ 0x80000000;
                    *(int *)&pOVar4->y = SUB84(local_1a8.y,0);
                    *(uint *)((long)&pOVar4->y + 4) =
                         (uint)((ulong)local_1a8.y >> 0x20) ^ 0x80000000;
                    *(undefined4 *)&pOVar4->z = local_1a8.z._0_4_;
                    *(uint *)((long)&pOVar4->z + 4) = local_1a8.z._4_4_ ^ 0x80000000;
                    *(int *)&pOVar4->d = SUB84(local_1a8.d - local_188,0);
                    *(uint *)((long)&pOVar4->d + 4) =
                         (uint)((ulong)(local_1a8.d - local_188) >> 0x20) ^ 0x80000000;
                  }
                }
              }
              lVar10 = lVar10 + 1;
            } while ((int)lVar10 < iVar5);
          }
          local_140 = local_140 + 1;
          uVar6 = local_110;
          uVar7 = local_118;
        } while (local_110 != uVar9);
      }
      local_118 = uVar7;
      local_148 = local_148 + 1;
      local_150 = local_150 + 1;
    } while (local_118 != uVar9);
    iVar3 = hull->m_count;
    iVar5 = (int)local_170;
    if (((iVar3 < (int)local_120) && (-1 < iVar5)) && (iVar5 <= hull->m_capacity)) {
      hull->m_count = iVar5;
      iVar3 = iVar5;
    }
    iVar3 = iVar3 - iVar5;
  }
  return iVar3;
}

Assistant:

bool ON_2fVector::IsUnset() const
{
  return Internal_IsUnsetFloat(2, &x);
}